

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_wstring_equal_integer_literal(void)

{
  undefined1 local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39f [2];
  undefined1 local_39d;
  uint local_39c;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35f [2];
  undefined1 local_35d;
  uint local_35c;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29f [2];
  undefined1 local_29d;
  uint local_29c;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25f [2];
  undefined1 local_25d;
  uint local_25c;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_222 [2];
  uint local_220;
  undefined1 local_219;
  uint big_1;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19f [2];
  undefined1 local_19d;
  int local_19c;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15f [2];
  undefined1 local_15d;
  int local_15c;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9f [2];
  undefined1 local_9d;
  int local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  int local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_e [2];
  int local_c [2];
  int big;
  
  local_c[0] = 0x7fffffff;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  local_4c = 0;
  local_e[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == 0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8a8,"void equality_suite::compare_wstring_equal_integer_literal()",local_e,&local_4d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,L"");
  local_9c = 0;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != 0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8a9,"void equality_suite::compare_wstring_equal_integer_literal()",local_5e,
             &local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"");
  local_9f[0] = trial::dynamic::operator==(&local_d8,local_c);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8aa,"void equality_suite::compare_wstring_equal_integer_literal()",local_9f,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,L"");
  local_db[0] = trial::dynamic::operator!=(&local_118,local_c);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8ab,"void equality_suite::compare_wstring_equal_integer_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"bravo");
  local_15c = 0;
  local_11b[0] = trial::dynamic::operator==(&local_158,&local_15c);
  local_15d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == 0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8ad,"void equality_suite::compare_wstring_equal_integer_literal()",local_11b,
             &local_15d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  local_19c = 0;
  local_15f[0] = trial::dynamic::operator!=(&local_198,&local_19c);
  local_19d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != 0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8ae,"void equality_suite::compare_wstring_equal_integer_literal()",local_15f,
             &local_19d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,L"bravo");
  local_19f[0] = trial::dynamic::operator==(&local_1d8,local_c);
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8af,"void equality_suite::compare_wstring_equal_integer_literal()",local_19f,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&big_1,L"bravo");
  local_1db[0] = trial::dynamic::operator!=((basic_variable<std::allocator<char>_> *)&big_1,local_c)
  ;
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8b0,"void equality_suite::compare_wstring_equal_integer_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&big_1);
  local_220 = 0xffffffff;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,L"");
  local_25c = 0;
  local_222[0] = trial::dynamic::operator==(&local_258,&local_25c);
  local_25d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == 0U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8b6,"void equality_suite::compare_wstring_equal_integer_literal()",local_222,
             &local_25d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,L"");
  local_29c = 0;
  local_25f[0] = trial::dynamic::operator!=(&local_298,&local_29c);
  local_29d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != 0U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8b7,"void equality_suite::compare_wstring_equal_integer_literal()",local_25f,
             &local_29d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2d8,L"");
  local_29f[0] = trial::dynamic::operator==(&local_2d8,&local_220);
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8b8,"void equality_suite::compare_wstring_equal_integer_literal()",local_29f,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"");
  local_2db[0] = trial::dynamic::operator!=(&local_318,&local_220);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8b9,"void equality_suite::compare_wstring_equal_integer_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  local_35c = 0;
  local_31b[0] = trial::dynamic::operator==(&local_358,&local_35c);
  local_35d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == 0U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8bb,"void equality_suite::compare_wstring_equal_integer_literal()",local_31b,
             &local_35d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,L"bravo");
  local_39c = 0;
  local_35f[0] = trial::dynamic::operator!=(&local_398,&local_39c);
  local_39d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != 0U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8bc,"void equality_suite::compare_wstring_equal_integer_literal()",local_35f,
             &local_39d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3d8,L"bravo");
  local_39f[0] = trial::dynamic::operator==(&local_3d8,&local_220);
  local_3d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8bd,"void equality_suite::compare_wstring_equal_integer_literal()",local_39f,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_418,L"bravo");
  local_3db[0] = trial::dynamic::operator!=(&local_418,&local_220);
  local_419 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8be,"void equality_suite::compare_wstring_equal_integer_literal()",local_3db,
             &local_419);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  return;
}

Assistant:

void compare_wstring_equal_integer_literal()
{
    // wstring - signed
    {
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == 0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != 0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == 0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != 0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != big, true);
    }
    // wstring - unsigned
    {
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == 0U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != 0U, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == 0U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != 0U, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != big, true);
    }
}